

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausProcessClausesCut3(Clu_Man_t *p,Fra_Sml_t *pSimMan,Aig_Cut_t *pCut,int *pScores)

{
  int iVar1;
  uint *puVar2;
  int nWordsForSim;
  int nSeries;
  int nMints;
  int b;
  int k;
  int j;
  int i;
  int iMint;
  uint uWord;
  uint *pSims [16];
  uint Matrix [32];
  int *pScores_local;
  Aig_Cut_t *pCut_local;
  Fra_Sml_t *pSimMan_local;
  Clu_Man_t *p_local;
  
  iVar1 = pSimMan->nWordsTotal - p->nSimWordsPref;
  if (('\x01' < pCut->nFanins) && (pCut->nFanins < '\x11')) {
    if (iVar1 % 8 != 0) {
      __assert_fail("nWordsForSim % 8 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                    ,299,
                    "void Fra_ClausProcessClausesCut3(Clu_Man_t *, Fra_Sml_t *, Aig_Cut_t *, int *)"
                   );
    }
    for (k = 0; k < pCut->nFanins; k = k + 1) {
      puVar2 = Fra_ObjSim(pSimMan,*(int *)((long)&pCut[1].pNext + (long)k * 4));
      *(uint **)(&iMint + (long)k * 2) = puVar2 + p->nSimWordsPref;
    }
    memset(pScores,0,(long)(1 << (pCut->nFanins & 0x1fU)) << 2);
    if (pCut->nLeafMax == '\x04') {
      for (k = 0; k < iVar1 / 8; k = k + 1) {
        memset(pSims + 0xf,0,0x80);
        for (nMints = 0; nMints < 8; nMints = nMints + 1) {
          for (b = 0; b < pCut->nFanins; b = b + 1) {
            Matrix[(long)(0x1f - (nMints * 4 + b)) + -2] =
                 *(uint *)(*(long *)(&iMint + (long)b * 2) + (long)(k * 8 + nMints) * 4);
          }
        }
        transpose32a((uint *)(pSims + 0xf));
        for (nMints = 0; nMints < 0x20; nMints = nMints + 1) {
          b = 0;
          i = Matrix[(long)nMints + -2];
          for (; b < 8; b = b + 1) {
            pScores[i & 0xfU] = pScores[i & 0xfU] + 1;
            i = (uint)i >> 4;
          }
        }
      }
    }
    else {
      for (k = 0; k < iVar1; k = k + 1) {
        for (nMints = 0; nMints < 0x20; nMints = nMints + 1) {
          j = 0;
          for (nSeries = 0; nSeries < pCut->nFanins; nSeries = nSeries + 1) {
            if ((*(uint *)(*(long *)(&iMint + (long)nSeries * 2) + (long)k * 4) &
                1 << ((byte)nMints & 0x1f)) != 0) {
              j = 1 << ((byte)nSeries & 0x1f) | j;
            }
          }
          pScores[j] = pScores[j] + 1;
        }
      }
    }
    return;
  }
  __assert_fail("pCut->nFanins > 1 && pCut->nFanins < 17",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                ,0x12a,
                "void Fra_ClausProcessClausesCut3(Clu_Man_t *, Fra_Sml_t *, Aig_Cut_t *, int *)");
}

Assistant:

void Fra_ClausProcessClausesCut3( Clu_Man_t * p, Fra_Sml_t * pSimMan, Aig_Cut_t * pCut, int * pScores )
{
    unsigned Matrix[32];
    unsigned * pSims[16], uWord;
    int iMint, i, j, k, b, nMints, nSeries;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;

    // compute parameters
    assert( pCut->nFanins > 1 && pCut->nFanins < 17 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nFanins; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pFanins[i] ) + p->nSimWordsPref;
    // add combinational patterns
    nMints = (1 << pCut->nFanins);
    memset( pScores, 0, sizeof(int) * nMints );

    if ( pCut->nLeafMax == 4 )
    {
        // convert the simulation patterns
        nSeries = nWordsForSim / 8;
        for ( i = 0; i < nSeries; i++ )
        {
            memset( Matrix, 0, sizeof(unsigned) * 32 );
            for ( k = 0; k < 8; k++ )
                for ( j = 0; j < (int)pCut->nFanins; j++ )
                    Matrix[31-(k*4+j)] = pSims[j][i*8+k];
            transpose32a( Matrix );
            for ( k = 0; k < 32; k++ )
                for ( j = 0, uWord = Matrix[k]; j < 8; j++, uWord >>= 4 )
                    pScores[uWord & 0xF]++;
        }
    }
    else
    {
        // go through the simulation patterns
        for ( i = 0; i < nWordsForSim; i++ )
            for ( k = 0; k < 32; k++ )
            {
                iMint = 0;
                for ( b = 0; b < (int)pCut->nFanins; b++ )
                    if ( pSims[b][i] & (1 << k) )
                        iMint |= (1 << b);
                pScores[iMint]++;
            }
    }
}